

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

Script * __thiscall
cfd::core::Psbt::GetTxInRedeemScriptDirect
          (Script *__return_storage_ptr__,Psbt *this,uint32_t index,bool ignore_error,
          bool is_witness)

{
  long lVar1;
  uint8_t *puVar2;
  CfdException *this_00;
  long lVar3;
  undefined3 in_register_00000081;
  allocator local_51;
  undefined1 local_50 [32];
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0xa4f,"GetTxInRedeemScriptDirect");
  lVar1 = *(long *)((long)this->wally_psbt_pointer_ + 0x10);
  lVar3 = (ulong)index * 0x110;
  if (CONCAT31(in_register_00000081,is_witness) == 0) {
    puVar2 = *(uint8_t **)(lVar1 + 0x10 + lVar3);
    if (puVar2 == (uint8_t *)0x0) goto LAB_001e8465;
    ByteData::ByteData((ByteData *)local_50,puVar2,*(uint32_t *)(lVar1 + 0x18 + lVar3));
    Script::Script(__return_storage_ptr__,(ByteData *)local_50);
  }
  else {
    puVar2 = *(uint8_t **)(lVar1 + 0x20 + lVar3);
    if (puVar2 == (uint8_t *)0x0) {
LAB_001e8465:
      if (ignore_error) {
        Script::Script(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      local_50._0_8_ = "cfdcore_psbt.cpp";
      local_50._8_4_ = 0xa61;
      local_50._16_8_ = "GetTxInRedeemScriptDirect";
      logger::warn<>((CfdSourceLocation *)local_50,"script not found.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_50,"psbt script not found error.",&local_51);
      CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData((ByteData *)local_50,puVar2,*(uint32_t *)(lVar1 + 0x28 + lVar3));
    Script::Script(__return_storage_ptr__,(ByteData *)local_50);
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

Script Psbt::GetTxInRedeemScriptDirect(
    uint32_t index, bool ignore_error, bool is_witness) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  if (is_witness && (psbt_pointer->inputs[index].witness_script != nullptr)) {
    return Script(ByteData(
        psbt_pointer->inputs[index].witness_script,
        static_cast<uint32_t>(
            psbt_pointer->inputs[index].witness_script_len)));
  } else if (
      (!is_witness) &&
      (psbt_pointer->inputs[index].redeem_script != nullptr)) {
    return Script(ByteData(
        psbt_pointer->inputs[index].redeem_script,
        static_cast<uint32_t>(psbt_pointer->inputs[index].redeem_script_len)));
  } else if (ignore_error) {
    return Script();
  } else {
    warn(CFD_LOG_SOURCE, "script not found.");
    throw CfdException(kCfdIllegalStateError, "psbt script not found error.");
  }
}